

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

Layer * ncnn::create_layer(char *type)

{
  int iVar1;
  Layer *pLVar2;
  undefined **ppuVar3;
  int i;
  ulong uVar4;
  
  ppuVar3 = &PTR_AbsVal_final_layer_creator_001836e8;
  uVar4 = 0;
  while (iVar1 = strcmp(type,ppuVar3[-1]), iVar1 != 0) {
    uVar4 = uVar4 + 1;
    ppuVar3 = ppuVar3 + 2;
    if (uVar4 == 0x4b) {
      return (Layer *)0x0;
    }
  }
  if ((uVar4 < 0x4b) && ((code *)*ppuVar3 != (code *)0x0)) {
    pLVar2 = (Layer *)(*(code *)*ppuVar3)();
    pLVar2->typeindex = (int)uVar4;
    return pLVar2;
  }
  return (Layer *)0x0;
}

Assistant:

Layer* create_layer(const char* type)
{
    int index = layer_to_index(type);
    if (index == -1)
        return 0;

    return create_layer(index);
}